

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O3

wchar_t initialize_summary(player *p,equippable_summary **s)

{
  size_t len;
  loc grid;
  loc grid_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  _Bool _Var4;
  wchar_t wVar5;
  equippable_summary *peVar6;
  ui_entry_iterator *i;
  ui_entry **ppuVar7;
  wchar_t **ppwVar8;
  wchar_t *pwVar9;
  ui_entry *puVar10;
  equippable_expr *peVar11;
  equippable_expr_class *peVar12;
  equippable_arranger *peVar13;
  object *poVar14;
  store *psVar15;
  equippable *peVar16;
  int *piVar17;
  long lVar18;
  wchar_t wVar19;
  code *pcVar20;
  uint uVar21;
  prop_category *ppVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  void *pvVar26;
  int iVar28;
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  int iVar31;
  undefined1 auVar30 [16];
  wchar_t count;
  player *p_1;
  wchar_t a;
  wchar_t v;
  cached_player_data *pcache;
  char *test_categories [2];
  add_obj_to_summary_closure add_obj_data;
  wchar_t local_dc;
  player *local_d8;
  int local_cc;
  prop_category *local_c8;
  void *local_c0;
  cached_object_data *local_b8;
  ulong local_b0;
  int local_a4;
  cached_player_data *local_a0;
  ui_entry_combiner_funcs local_98;
  equippable_summary *local_70;
  player *local_68;
  equippable_summary *local_60;
  undefined4 local_58;
  obj_visitor_data local_50;
  
  peVar6 = the_summary;
  local_d8 = p;
  if (the_summary != (equippable_summary *)0x0) goto LAB_001e597b;
  peVar6 = (equippable_summary *)mem_alloc(0x200);
  lVar25 = 0;
  the_summary = peVar6;
  peVar6->items = (equippable *)0x0;
  peVar6->nitems = L'\0';
  peVar6->nalloc = L'\0';
  peVar6->p_and_eq_auxvals = (int *)0x0;
  peVar6->dlg_trans_msg = (char *)0x0;
  peVar6->sorted_indices = (int *)0x0;
  peVar6->p_and_eq_vals = (int *)0x0;
  peVar6->stores = EQUIPPABLE_NO_STORE;
  peVar6->ifirst = L'\0';
  peVar6->indinc = L'\x01';
  peVar6->iview = L'\0';
  peVar6->npage = L'\0';
  peVar6->nshortnm = L'\0';
  peVar6->nproplab = L'\x02';
  peVar6->irow_combined_equip = L'\x03';
  peVar6->icol_name = L'\x04';
  peVar6->term_ncol = L'\xffffffff';
  peVar6->term_nrow = L'\xffffffff';
  peVar6->nprop = L'\0';
  local_98.init_func = (_func_void_int_int_ui_entry_combiner_state_ptr *)0x23d8a5;
  do {
    local_98.accum_func =
         (_func_void_int_int_ui_entry_combiner_state_ptr *)
         (&PTR_anon_var_dwarf_193d47_00284ae0)[lVar25];
    i = initialize_ui_entry_iterator(check_for_two_categories,&local_98,(char *)local_98.accum_func)
    ;
    wVar5 = count_ui_entry_iterator(i);
    peVar6 = the_summary;
    the_summary->nprop = the_summary->nprop + wVar5;
    peVar6->propcats[lVar25].n = wVar5;
    wVar19 = L'\0';
    if (lVar25 != 0) {
      wVar19 = peVar6->propcats[lVar25 + -1].n + peVar6->propcats[lVar25 + -1].off;
    }
    peVar6->propcats[lVar25].off = wVar19;
    len = (long)wVar5 * 8;
    ppuVar7 = (ui_entry **)mem_alloc(len);
    the_summary->propcats[lVar25].entries = ppuVar7;
    ppwVar8 = (wchar_t **)mem_alloc(len);
    peVar6 = the_summary;
    the_summary->propcats[lVar25].labels = ppwVar8;
    pwVar9 = (wchar_t *)mem_alloc(((long)peVar6->nproplab + 1) * (long)wVar5 * 4);
    the_summary->propcats[lVar25].label_buffer = pwVar9;
    if (L'\0' < wVar5) {
      uVar24 = 0;
      do {
        puVar10 = advance_ui_entry_iterator(i);
        peVar6 = the_summary;
        the_summary->propcats[lVar25].entries[uVar24] = puVar10;
        peVar6->propcats[lVar25].labels[uVar24] =
             peVar6->propcats[lVar25].label_buffer +
             (long)(int)uVar24 * ((long)peVar6->nproplab + 1);
        get_ui_entry_label(puVar10,the_summary->nproplab + L'\x01',true,
                           the_summary->propcats[lVar25].labels[uVar24]);
        uVar24 = uVar24 + 1;
      } while ((uint)wVar5 != uVar24);
    }
    release_ui_entry_iterator(i);
    lVar25 = lVar25 + 1;
  } while (lVar25 != 5);
  (the_summary->easy_filt).nalloc = L'\x05';
  peVar11 = (equippable_expr *)mem_alloc(0x78);
  p = local_d8;
  peVar6 = the_summary;
  (the_summary->easy_filt).v = peVar11;
  switch(peVar6->stores) {
  case EQUIPPABLE_NO_STORE:
    (peVar6->easy_filt).simple = EQUIP_EXPR_AND;
    (peVar6->easy_filt).nv = L'\x01';
    pcVar20 = sel_exclude_src;
    goto LAB_001e5786;
  case EQUIPPABLE_ONLY_STORE:
    (peVar6->easy_filt).simple = EQUIP_EXPR_AND;
    (peVar6->easy_filt).nv = L'\x01';
    pcVar20 = sel_only_src;
LAB_001e5786:
    (peVar11->s).func = pcVar20;
    peVar6 = the_summary;
    (((the_summary->easy_filt).v)->s).ex.src = EQUIP_SOURCE_STORE;
    peVar11 = (peVar6->easy_filt).v;
    peVar11->c = EQUIP_EXPR_SELECTOR;
    break;
  case EQUIPPABLE_YES_STORE:
    (peVar6->easy_filt).simple = EQUIP_EXPR_TERMINATOR;
    (peVar6->easy_filt).nv = L'\0';
    break;
  case EQUIPPABLE_ONLY_CARRIED:
    (peVar6->easy_filt).simple = EQUIP_EXPR_AND;
    (peVar6->easy_filt).nv = L'\x03';
    (peVar11->s).func = sel_exclude_src;
    peVar6 = the_summary;
    (((the_summary->easy_filt).v)->s).ex.src = EQUIP_SOURCE_STORE;
    peVar11 = (peVar6->easy_filt).v;
    peVar11->c = EQUIP_EXPR_SELECTOR;
    peVar11[1].s.func = sel_exclude_src;
    peVar11[1].s.ex.src = EQUIP_SOURCE_HOME;
    peVar11 = (peVar6->easy_filt).v;
    peVar11[1].c = EQUIP_EXPR_SELECTOR;
    peVar11[2].s.func = sel_exclude_src;
    peVar11[2].s.ex.src = EQUIP_SOURCE_FLOOR;
    peVar11 = (peVar6->easy_filt).v;
    peVar11[2].c = EQUIP_EXPR_SELECTOR;
  }
  auVar3 = _DAT_002256f0;
  auVar2 = _DAT_00224950;
  auVar1 = _DAT_00224940;
  wVar5 = (peVar6->easy_filt).nv;
  wVar19 = (peVar6->easy_filt).nalloc;
  if (wVar5 < wVar19) {
    lVar25 = (long)wVar19 - (long)wVar5;
    lVar23 = lVar25 + -1;
    auVar27._8_4_ = (int)lVar23;
    auVar27._0_8_ = lVar23;
    auVar27._12_4_ = (int)((ulong)lVar23 >> 0x20);
    peVar12 = &peVar11[(long)wVar5 + 3].c;
    uVar24 = 0;
    auVar27 = auVar27 ^ _DAT_00224950;
    do {
      auVar29._8_4_ = (int)uVar24;
      auVar29._0_8_ = uVar24;
      auVar29._12_4_ = (int)(uVar24 >> 0x20);
      auVar30 = (auVar29 | auVar1) ^ auVar2;
      iVar28 = auVar27._4_4_;
      if ((bool)(~(auVar30._4_4_ == iVar28 && auVar27._0_4_ < auVar30._0_4_ ||
                  iVar28 < auVar30._4_4_) & 1)) {
        peVar12[-0x12] = 3;
      }
      if ((auVar30._12_4_ != auVar27._12_4_ || auVar30._8_4_ <= auVar27._8_4_) &&
          auVar30._12_4_ <= auVar27._12_4_) {
        peVar12[-0xc] = 3;
      }
      auVar29 = (auVar29 | auVar3) ^ auVar2;
      iVar31 = auVar29._4_4_;
      if (iVar31 <= iVar28 && (iVar31 != iVar28 || auVar29._0_4_ <= auVar27._0_4_)) {
        peVar12[-6] = 3;
        *peVar12 = EQUIP_EXPR_TERMINATOR;
      }
      uVar24 = uVar24 + 4;
      peVar12 = peVar12 + 0x18;
    } while ((lVar25 + 3U & 0xfffffffffffffffc) != uVar24);
  }
  (peVar6->config_filt).v = (equippable_expr *)0x0;
  (peVar6->config_filt).simple = EQUIP_EXPR_TERMINATOR;
  (peVar6->config_filt).nv = L'\0';
  (peVar6->config_filt).nalloc = L'\0';
  (peVar6->config_mod_filt).v = (equippable_expr *)0x0;
  (peVar6->config_mod_filt).simple = EQUIP_EXPR_TERMINATOR;
  (peVar6->config_mod_filt).nv = L'\0';
  (peVar6->config_mod_filt).nalloc = L'\0';
  peVar6->config_filt_is_on = false;
  (peVar6->default_sort).nalloc = L'\x05';
  peVar13 = (equippable_arranger *)mem_alloc(0x50);
  peVar6 = the_summary;
  (the_summary->default_sort).v = peVar13;
  peVar13->func = cmp_by_slot;
  peVar13->propind = L'\0';
  peVar13[1].func = cmp_by_location;
  peVar13[1].propind = L'\0';
  peVar13[2].func = cmp_by_quality;
  peVar13[2].propind = L'\0';
  peVar13[3].func = cmp_by_short_name;
  peVar13[3].propind = L'\0';
  peVar13[4].func = (equippable_cmpfunc)0x0;
  peVar13[4].propind = L'\0';
  (peVar6->default_sort).nv = L'\x04';
  peVar6->config_sort_is_on = false;
  (peVar6->config_sort).v = (equippable_arranger *)0x0;
  (peVar6->config_sort).nv = L'\0';
  (peVar6->config_sort).nalloc = L'\0';
LAB_001e597b:
  wVar5 = reconfigure_for_term_if_necessary(false,p,peVar6);
  wVar19 = L'\x01';
  if (wVar5 == L'\0') {
    local_50.usefunc_closure = &local_dc;
    local_dc = L'\0';
    local_50.usefunc = count_objects;
    local_50.selfunc = select_any;
    local_50.selfunc_closure = (player *)0x0;
    apply_visitor_to_equipped(p,&local_50);
    poVar14 = p->gear;
    if (poVar14 != (object *)0x0) {
      do {
        _Var4 = tval_is_wearable(poVar14);
        if ((_Var4) && (_Var4 = object_is_equipped(p->body,poVar14), !_Var4)) {
          local_dc = local_dc + L'\x01';
        }
        poVar14 = poVar14->next;
      } while (poVar14 != (object *)0x0);
    }
    if (cave != (chunk_conflict *)0x0) {
      local_50.selfunc = select_seen_wearable;
      grid.x = (p->grid).x;
      grid.y = (p->grid).y;
      local_50.selfunc_closure = p;
      for (poVar14 = square_object(cave,grid); poVar14 != (object *)0x0; poVar14 = poVar14->next) {
        _Var4 = select_seen_wearable(poVar14,p);
        if (_Var4) {
          local_dc = local_dc + L'\x01';
        }
      }
    }
    psVar15 = store_home(p);
    if (psVar15 != (store *)0x0) {
      psVar15 = store_home(p);
      for (poVar14 = psVar15->stock; poVar14 != (object *)0x0; poVar14 = poVar14->next) {
        _Var4 = tval_is_wearable(poVar14);
        if (_Var4) {
          local_dc = local_dc + L'\x01';
        }
      }
    }
    local_60 = the_summary;
    if (the_summary->nalloc < local_dc) {
      mem_free(the_summary->sorted_indices);
      cleanup_summary_items(the_summary);
      mem_free(the_summary->items);
      peVar16 = (equippable *)mem_zalloc((long)local_dc * 0x38);
      the_summary->items = peVar16;
      piVar17 = (int *)mem_alloc((long)local_dc * 4 + 4);
      local_60 = the_summary;
      the_summary->sorted_indices = piVar17;
      local_60->nalloc = local_dc;
    }
    local_60->nitems = L'\0';
    local_50.usefunc = add_obj_to_summary;
    local_50.usefunc_closure = &local_68;
    local_58 = 0;
    local_50.selfunc = select_any;
    local_50.selfunc_closure = (void *)0x0;
    local_68 = p;
    apply_visitor_to_equipped(p,&local_50);
    local_58 = 1;
    poVar14 = p->gear;
    if (poVar14 != (object *)0x0) {
      do {
        _Var4 = tval_is_wearable(poVar14);
        if ((_Var4) && (_Var4 = object_is_equipped(p->body,poVar14), !_Var4)) {
          add_obj_to_summary(poVar14,&local_68);
        }
        poVar14 = poVar14->next;
      } while (poVar14 != (object *)0x0);
    }
    if (cave != (chunk_conflict *)0x0) {
      local_58 = 2;
      grid_00.x = (p->grid).x;
      grid_00.y = (p->grid).y;
      poVar14 = square_object(cave,grid_00);
      if (poVar14 != (object *)0x0) {
        do {
          _Var4 = select_seen_wearable(poVar14,p);
          if (_Var4) {
            add_obj_to_summary(poVar14,&local_68);
          }
          poVar14 = poVar14->next;
        } while (poVar14 != (object *)0x0);
      }
    }
    local_58 = 3;
    psVar15 = store_home(p);
    if (psVar15 != (store *)0x0) {
      psVar15 = store_home(p);
      poVar14 = psVar15->stock;
      if (poVar14 != (object *)0x0) {
        do {
          _Var4 = tval_is_wearable(poVar14);
          if (_Var4) {
            add_obj_to_summary(poVar14,&local_68);
          }
          poVar14 = poVar14->next;
        } while (poVar14 != (object *)0x0);
      }
    }
    peVar6 = the_summary;
    if (the_summary->p_and_eq_vals == (int *)0x0) {
      piVar17 = (int *)mem_alloc((long)the_summary->nprop << 2);
      peVar6->p_and_eq_vals = piVar17;
    }
    if (peVar6->p_and_eq_auxvals == (int *)0x0) {
      piVar17 = (int *)mem_alloc((long)peVar6->nprop << 2);
      peVar6->p_and_eq_auxvals = piVar17;
    }
    local_a0 = (cached_player_data *)0x0;
    local_c0 = mem_alloc((long)peVar6->nprop << 4);
    local_70 = peVar6;
    local_c8 = peVar6->propcats;
    uVar24 = 0;
    do {
      local_b0 = uVar24;
      if (L'\0' < local_c8[uVar24].n) {
        ppVar22 = local_c8 + uVar24;
        lVar25 = 0;
        pvVar26 = local_c0;
        do {
          puVar10 = ppVar22->entries[lVar25];
          wVar5 = get_ui_entry_renderer_index(puVar10);
          wVar5 = ui_entry_renderer_query_combiner(wVar5);
          if (wVar5 < L'\x01') {
            __assert_fail("combind > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                          ,0x8dd,
                          "void compute_player_and_equipment_values(struct player *, struct equippable_summary *)"
                         );
          }
          ui_entry_combiner_get_funcs(wVar5,&local_98);
          p = local_d8;
          compute_ui_entry_values_for_player(puVar10,local_d8,&local_a0,(int *)&local_b8,&local_cc);
          (*local_98.init_func)
                    ((int)local_b8,local_cc,
                     (ui_entry_combiner_state *)((long)ppVar22->off * 0x10 + (long)pvVar26));
          lVar25 = lVar25 + 1;
          pvVar26 = (void *)((long)pvVar26 + 0x10);
        } while (lVar25 < ppVar22->n);
      }
      uVar24 = local_b0 + 1;
    } while (uVar24 != 5);
    release_cached_player_data(local_a0);
    if ((p->body).count != 0) {
      uVar24 = 0;
      do {
        poVar14 = slot_object(p,(wchar_t)uVar24);
        local_b8 = (cached_object_data *)0x0;
        if (poVar14 != (object *)0x0) {
          lVar25 = 0;
          local_b0 = uVar24;
          do {
            if (L'\0' < local_c8[lVar25].n) {
              ppVar22 = local_c8 + lVar25;
              lVar23 = 0;
              pvVar26 = local_c0;
              do {
                wVar5 = get_ui_entry_renderer_index(ppVar22->entries[lVar23]);
                wVar5 = ui_entry_renderer_query_combiner(wVar5);
                if (wVar5 < L'\x01') {
                  __assert_fail("combind > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                                ,0x8fa,
                                "void compute_player_and_equipment_values(struct player *, struct equippable_summary *)"
                               );
                }
                ui_entry_combiner_get_funcs(wVar5,&local_98);
                compute_ui_entry_values_for_object
                          (ppVar22->entries[lVar23],poVar14,local_d8,&local_b8,&local_cc,&local_a4);
                (*local_98.accum_func)
                          (local_cc,local_a4,
                           (ui_entry_combiner_state *)((long)ppVar22->off * 0x10 + (long)pvVar26));
                lVar23 = lVar23 + 1;
                pvVar26 = (void *)((long)pvVar26 + 0x10);
              } while (lVar23 < ppVar22->n);
            }
            lVar25 = lVar25 + 1;
          } while (lVar25 != 5);
          release_cached_object_data(local_b8);
          uVar24 = local_b0;
          p = local_d8;
        }
        uVar21 = (int)uVar24 + 1;
        uVar24 = (ulong)uVar21;
      } while (uVar21 < (p->body).count);
    }
    peVar6 = local_70;
    lVar25 = 0;
    do {
      if (L'\0' < local_c8[lVar25].n) {
        ppVar22 = local_c8 + lVar25;
        lVar23 = 0;
        pvVar26 = local_c0;
        do {
          wVar5 = get_ui_entry_renderer_index(ppVar22->entries[lVar23]);
          wVar5 = ui_entry_renderer_query_combiner(wVar5);
          if (wVar5 < L'\x01') {
            __assert_fail("combind > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                          ,0x911,
                          "void compute_player_and_equipment_values(struct player *, struct equippable_summary *)"
                         );
          }
          ui_entry_combiner_get_funcs(wVar5,&local_98);
          (*local_98.finish_func)
                    ((ui_entry_combiner_state *)((long)ppVar22->off * 0x10 + (long)pvVar26));
          lVar18 = ppVar22->off + lVar23;
          peVar6->p_and_eq_vals[lVar18] = *(int *)((long)local_c0 + lVar18 * 0x10 + 8);
          lVar18 = ppVar22->off + lVar23;
          peVar6->p_and_eq_auxvals[lVar18] = *(int *)((long)local_c0 + lVar18 * 0x10 + 0xc);
          lVar23 = lVar23 + 1;
          pvVar26 = (void *)((long)pvVar26 + 0x10);
        } while (lVar23 < ppVar22->n);
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 != 5);
    mem_free(local_c0);
    filter_items(the_summary);
    sort_dat_0 = the_summary->items;
    sort_dat_1 = (&the_summary->default_sort)[the_summary->config_sort_is_on].v;
    sort(the_summary->sorted_indices,(long)the_summary->nfilt,4,cmp_for_sort_items);
    peVar6 = the_summary;
    peVar6->isel0 = L'\xffffffff';
    peVar6->isel1 = L'\xffffffff';
    peVar6->work_sel = L'\xffffffff';
    wVar19 = L'\0';
  }
  return wVar19;
}

Assistant:

static int initialize_summary(struct player *p,
	struct equippable_summary **s)
{
	struct obj_visitor_data visitor;
	struct add_obj_to_summary_closure add_obj_data;
	int count, i;

	if (*s == NULL) {
		const char *categories[] = {
			"resistances",
			"abilities",
			"hindrances",
			"modifiers",
			"stat_modifiers"
		};
		const char *test_categories[2];

		*s = mem_alloc(sizeof(**s));
		(*s)->items = NULL;
		(*s)->sorted_indices = NULL;
		(*s)->p_and_eq_vals = NULL;
		(*s)->p_and_eq_auxvals = NULL;
		(*s)->dlg_trans_msg = NULL;
		(*s)->nitems = 0;
		(*s)->nalloc = 0;
		(*s)->stores = EQUIPPABLE_NO_STORE;
		(*s)->ifirst = 0;
		(*s)->indinc = 1;
		(*s)->iview = 0;
		(*s)->npage = 0;
		(*s)->nshortnm = 0;
		(*s)->term_ncol = -1;
		(*s)->term_nrow = -1;

		/* These are currently hardwired layout choices. */
		(*s)->nproplab = 2;
		(*s)->irow_combined_equip = (*s)->nproplab + 1;
		/*
		 * Leave room for a character (item character), a space,
		 * a character (item location code), and a space.
		 */
		(*s)->icol_name = 4;

		/*
		 * These need to be done once after the game configuration is
		 * read.
		 */
		(*s)->nprop = 0;
		test_categories[0] = "EQUIPCMP_SCREEN";
		for (i = 0; i < (int)N_ELEMENTS((*s)->propcats); ++i) {
			struct ui_entry_iterator *ui_iter;
			int n, j;

			test_categories[1] = categories[i];
			ui_iter = initialize_ui_entry_iterator(
				check_for_two_categories, test_categories,
				test_categories[1]);
			n = count_ui_entry_iterator(ui_iter);
			(*s)->nprop += n;
			(*s)->propcats[i].n = n;
			(*s)->propcats[i].off = (i == 0) ?
				0 : (*s)->propcats[i - 1].off +
				(*s)->propcats[i - 1].n;
			(*s)->propcats[i].entries = mem_alloc(n *
				sizeof(*(*s)->propcats[i].entries));
			(*s)->propcats[i].labels = mem_alloc(n *
				sizeof(*(*s)->propcats[i].labels));
			(*s)->propcats[i].label_buffer = mem_alloc(n *
				((*s)->nproplab + 1) *
				sizeof(*(*s)->propcats[i].label_buffer));
			for (j = 0; j < n; ++j) {
				struct ui_entry *entry =
					advance_ui_entry_iterator(ui_iter);

				(*s)->propcats[i].entries[j] = entry;
				(*s)->propcats[i].labels[j] =
					(*s)->propcats[i].label_buffer +
					j * ((*s)->nproplab + 1);
				get_ui_entry_label(entry,
					(*s)->nproplab + 1, true,
					(*s)->propcats[i].labels[j]);
			}
			release_ui_entry_iterator(ui_iter);
		}

		/*
		 * Start with nothing for the easy filter but set up space
		 * so it is trivial to add one term filtering on an attribute
		 * and up to three others that can filter on the source of the
		 * item.
		 */
		(*s)->easy_filt.nalloc = 5;
		(*s)->easy_filt.v = mem_alloc((*s)->easy_filt.nalloc *
			sizeof(*(*s)->easy_filt.v));
		switch ((*s)->stores) {
		case EQUIPPABLE_NO_STORE:
			(*s)->easy_filt.simple = EQUIP_EXPR_AND;
			(*s)->easy_filt.nv = 1;
			(*s)->easy_filt.v[0].s.func = sel_exclude_src;
			(*s)->easy_filt.v[0].s.ex.src = EQUIP_SOURCE_STORE;
			(*s)->easy_filt.v[0].c = EQUIP_EXPR_SELECTOR;
			break;

		case EQUIPPABLE_ONLY_STORE:
			(*s)->easy_filt.simple = EQUIP_EXPR_AND;
			(*s)->easy_filt.nv = 1;
			(*s)->easy_filt.v[0].s.func = sel_only_src;
			(*s)->easy_filt.v[0].s.ex.src = EQUIP_SOURCE_STORE;
			(*s)->easy_filt.v[0].c = EQUIP_EXPR_SELECTOR;
			break;

		case EQUIPPABLE_YES_STORE:
			/* There's no filtering to be done. */
			(*s)->easy_filt.simple = EQUIP_EXPR_TERMINATOR;
			(*s)->easy_filt.nv = 0;
			break;

		case EQUIPPABLE_ONLY_CARRIED:
			(*s)->easy_filt.simple = EQUIP_EXPR_AND;
			(*s)->easy_filt.nv = 3;
			(*s)->easy_filt.v[0].s.func = sel_exclude_src;
			(*s)->easy_filt.v[0].s.ex.src = EQUIP_SOURCE_STORE;
			(*s)->easy_filt.v[0].c = EQUIP_EXPR_SELECTOR;
			(*s)->easy_filt.v[1].s.func = sel_exclude_src;
			(*s)->easy_filt.v[1].s.ex.src = EQUIP_SOURCE_HOME;
			(*s)->easy_filt.v[1].c = EQUIP_EXPR_SELECTOR;
			(*s)->easy_filt.v[2].s.func = sel_exclude_src;
			(*s)->easy_filt.v[2].s.ex.src = EQUIP_SOURCE_FLOOR;
			(*s)->easy_filt.v[2].c = EQUIP_EXPR_SELECTOR;
		}

		for (i = (*s)->easy_filt.nv; i < (*s)->easy_filt.nalloc; ++i) {
			(*s)->easy_filt.v[i].c = EQUIP_EXPR_TERMINATOR;
		}

		/* Start with nothing for the specially configured filter. */
		(*s)->config_filt.v = NULL;
		(*s)->config_filt.simple = EQUIP_EXPR_TERMINATOR;
		(*s)->config_filt.nv = 0;
		(*s)->config_filt.nalloc = 0;
		(*s)->config_mod_filt.v = NULL;
		(*s)->config_mod_filt.simple = EQUIP_EXPR_TERMINATOR;
		(*s)->config_mod_filt.nv = 0;
		(*s)->config_mod_filt.nalloc = 0;
		(*s)->config_filt_is_on = false;

		/*
		 * The default sort is by equipment slot.  Any ties are
		 * resolved first by the location of the object, rough object
		 * quality, and then alphabetical order.
		 */
		(*s)->default_sort.nalloc = 5;
		(*s)->default_sort.v = mem_alloc((*s)->default_sort.nalloc *
			sizeof(*(*s)->default_sort.v));
		(*s)->default_sort.v[0].func = cmp_by_slot;
		(*s)->default_sort.v[0].propind = 0;
		(*s)->default_sort.v[1].func = cmp_by_location;
		(*s)->default_sort.v[1].propind = 0;
		(*s)->default_sort.v[2].func = cmp_by_quality;
		(*s)->default_sort.v[2].propind = 0;
		(*s)->default_sort.v[3].func = cmp_by_short_name;
		(*s)->default_sort.v[3].propind = 0;
		(*s)->default_sort.v[4].func = 0;
		(*s)->default_sort.v[4].propind = 0;
		(*s)->default_sort.nv = 4;

		/* Start with nothing for the specially configured sort. */
		(*s)->config_sort.v = NULL;
		(*s)->config_sort.nv = 0;
		(*s)->config_sort.nalloc = 0;
		(*s)->config_sort_is_on = false;
	}

	/* These need to be redone on a change to the terminal size. */
	if (reconfigure_for_term_if_necessary(false, p, *s)) {
		return 1;
	}

	/*
	 * These need to be redone for any change in the equipped items, pack,
	 * home, or stores.
	 */

	/* Count the available items to include. */
	count = 0;
	visitor.usefunc = count_objects;
	visitor.usefunc_closure = &count;
	visitor.selfunc = select_any;
	visitor.selfunc_closure = NULL;
	apply_visitor_to_equipped(p, &visitor);
	visitor.selfunc = select_nonequipped_wearable;
	visitor.selfunc_closure = p;
	apply_visitor_to_pile(p->gear, &visitor);
	if (cave) {
		visitor.selfunc = select_seen_wearable;
		visitor.selfunc_closure = p;
		apply_visitor_to_pile(square_object(cave, p->grid), &visitor);
	}
	visitor.selfunc = select_wearable;
	visitor.selfunc_closure = NULL;
	if (store_home(p)) {
		apply_visitor_to_pile(store_home(p)->stock, &visitor);
	}

	/* Allocate storage and add the available items. */
	if (count > (*s)->nalloc) {
		mem_free((*s)->sorted_indices);
		cleanup_summary_items(*s);
		mem_free((*s)->items);
		(*s)->items = mem_zalloc(count * sizeof(*(*s)->items));
		(*s)->sorted_indices =
			mem_alloc((count + 1) * sizeof(*(*s)->sorted_indices));
		(*s)->nalloc = count;
	}
	(*s)->nitems = 0;
	visitor.usefunc = add_obj_to_summary;
	visitor.usefunc_closure = &add_obj_data;
	add_obj_data.p = p;
	add_obj_data.summary = *s;
	add_obj_data.src = EQUIP_SOURCE_WORN;
	visitor.selfunc = select_any;
	visitor.selfunc_closure = NULL;
	apply_visitor_to_equipped(p, &visitor);
	add_obj_data.src = EQUIP_SOURCE_PACK;
	visitor.selfunc = select_nonequipped_wearable;
	visitor.selfunc_closure = p;
	apply_visitor_to_pile(p->gear, &visitor);
	if (cave) {
		add_obj_data.src = EQUIP_SOURCE_FLOOR;
		visitor.selfunc = select_seen_wearable;
		visitor.selfunc_closure = p;
		apply_visitor_to_pile(square_object(cave, p->grid), &visitor);
	}
	add_obj_data.src = EQUIP_SOURCE_HOME;
	visitor.selfunc = select_wearable;
	visitor.selfunc_closure = NULL;
	if (store_home(p)) {
		apply_visitor_to_pile(store_home(p)->stock, &visitor);
	}

	compute_player_and_equipment_values(p, *s);

	/*
	 * Do an initial filtering and sorting of the items so they're ready
	 * for display.
	 */
	filter_items(*s);
	sort_items(*s);

	/* Reset selection state. */
	(*s)->isel0 = -1;
	(*s)->isel1 = -1;
	(*s)->work_sel = -1;

	return 0;
}